

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::meshcoarsening(tetgenmesh *this)

{
  int iVar1;
  uint uVar2;
  tetgenbehavior *ptVar3;
  bool bVar4;
  int iVar5;
  arraypool *remptlist;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  long local_38;
  
  if (this->b->quiet == 0) {
    puts("Mesh coarsening ...");
  }
  remptlist = (arraypool *)operator_new(0x30);
  remptlist->objectbytes = 8;
  remptlist->objectsperblock = 0x400;
  remptlist->log2objectsperblock = 10;
  remptlist->objectsperblockmark = 0x3ff;
  remptlist->toparraylen = 0;
  remptlist->toparray = (char **)0x0;
  remptlist->objects = 0;
  remptlist->totalmemory = 0;
  collectremovepoints(this,remptlist);
  if (remptlist->objects != 0) {
    if ((0 < remptlist->objects) && (this->b->verbose != 0)) {
      printf("  Removing %ld points...\n");
    }
    local_38 = remptlist->objects;
    iVar1 = this->b->fliplinklevel;
    this->b->fliplinklevel = -1;
    uVar10 = 1;
    iVar9 = 0;
    while( true ) {
      this->autofliplinklevel = uVar10;
      if (1 < this->b->verbose) {
        uVar2 = this->b->fliplinklevel;
        pcVar8 = "auto";
        if (0 < (int)uVar2) {
          pcVar8 = "fixed";
          uVar10 = uVar2;
        }
        printf("    Removing points [%s level = %2d] #:  %ld.\n",pcVar8,(ulong)uVar10,
               remptlist->objects);
      }
      lVar7 = remptlist->objects;
      if (0 < lVar7) {
        uVar10 = 0;
        do {
          pcVar8 = remptlist->toparray[(int)uVar10 >> ((byte)remptlist->log2objectsperblock & 0x1f)]
          ;
          lVar7 = (long)remptlist->objectbytes *
                  (long)(int)(remptlist->objectsperblockmark & uVar10);
          iVar5 = removevertexbyflips(this,*(point *)(pcVar8 + lVar7));
          if (iVar5 != 0) {
            uVar6 = remptlist->objects - 1;
            *(undefined8 *)(pcVar8 + lVar7) =
                 *(undefined8 *)
                  (remptlist->toparray[(long)uVar6 >> ((byte)remptlist->log2objectsperblock & 0x3f)]
                  + (long)remptlist->objectbytes * ((long)remptlist->objectsperblockmark & uVar6));
            remptlist->objects = uVar6;
            uVar10 = uVar10 - 1;
          }
          uVar10 = uVar10 + 1;
          lVar7 = remptlist->objects;
        } while ((int)uVar10 < lVar7);
      }
      if (lVar7 < 1) goto LAB_00143d5a;
      ptVar3 = this->b;
      if (-1 < ptVar3->fliplinklevel) break;
      if (lVar7 == local_38) {
        iVar5 = iVar9 + 1;
        bVar4 = 1 < iVar9;
        iVar9 = iVar5;
        if (bVar4) {
          ptVar3->fliplinklevel = 100000;
        }
      }
      else {
        iVar9 = iVar9 - (uint)(0 < iVar9);
        local_38 = lVar7;
      }
      uVar10 = this->autofliplinklevel + ptVar3->fliplinklevelinc;
    }
    if ((0 < lVar7) && (this->b->verbose != 0)) {
      printf("  %ld points are not removed !\n");
    }
LAB_00143d5a:
    this->b->fliplinklevel = iVar1;
  }
  arraypool::~arraypool(remptlist);
  operator_delete(remptlist,0x30);
  return;
}

Assistant:

void tetgenmesh::meshcoarsening()
{
  arraypool *remptlist;

  if (!b->quiet) {
    printf("Mesh coarsening ...\n");
  }

  // Collect the set of points to be removed
  remptlist = new arraypool(sizeof(point *), 10);
  collectremovepoints(remptlist);

  if (remptlist->objects == 0l) {
    delete remptlist;
    return;
  }

  if (b->verbose) {
    if (remptlist->objects > 0l) {
      printf("  Removing %ld points...\n", remptlist->objects);
    }
  }

  point *parypt, *plastpt;
  long ms = remptlist->objects;
  int nit = 0; 
  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = -1;
  autofliplinklevel = 1; // Init value.
  int i;

  while (1) {
  
    if (b->verbose > 1) {
      printf("    Removing points [%s level = %2d] #:  %ld.\n", 
             (b->fliplinklevel > 0) ? "fixed" : "auto",
             (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
             remptlist->objects);
    }

    // Remove the list of points.
    for (i = 0; i < remptlist->objects; i++) {
      parypt = (point *) fastlookup(remptlist, i);
      if (removevertexbyflips(*parypt)) {
        // Move the last entry to the current place.
        plastpt = (point *) fastlookup(remptlist, remptlist->objects - 1);
        *parypt = *plastpt;
        remptlist->objects--;
        i--;
      }
    }

    if (remptlist->objects > 0l) {
      if (b->fliplinklevel >= 0) {
        break; // We have tried all levels.
      }
      if (remptlist->objects == ms) {
        nit++;
        if (nit >= 3) {
          // Do the last round with unbounded flip link level.
          b->fliplinklevel = 100000;
        }
      } else {
        ms = remptlist->objects;
        if (nit > 0) {
          nit--;
        }
      }
      autofliplinklevel+=b->fliplinklevelinc;
    } else {
      // All points are removed.
      break;
    }
  } // while (1)

  if (remptlist->objects > 0l) {
    if (b->verbose) {
      printf("  %ld points are not removed !\n", remptlist->objects);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;
  delete remptlist;
}